

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evthread.c
# Opt level: O2

void debug_lock_free(void *lock_,uint locktype)

{
  undefined8 uVar1;
  char *pcVar2;
  
  if (*(int *)((long)lock_ + 0x10) == 0) {
    if (*(uint *)((long)lock_ + 4) == locktype) {
      if (*lock_ == -0x214f4ef4) {
        if (original_lock_fns_.free != (_func_void_void_ptr_uint *)0x0) {
          (*original_lock_fns_.free)(*(void **)((long)lock_ + 0x18),locktype | 1);
        }
        *(undefined8 *)((long)lock_ + 0x18) = 0;
        *(undefined4 *)((long)lock_ + 0x10) = 0xffffff9c;
        *(undefined4 *)lock_ = 0x12300fda;
        event_mm_free_(lock_);
        return;
      }
      pcVar2 = "DEBUG_LOCK_SIG == lock->signature";
      uVar1 = 0xde;
    }
    else {
      pcVar2 = "locktype == lock->locktype";
      uVar1 = 0xdd;
    }
  }
  else {
    pcVar2 = "lock->count == 0";
    uVar1 = 0xdc;
  }
  event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evthread.c"
             ,uVar1,pcVar2,"debug_lock_free");
}

Assistant:

static void
debug_lock_free(void *lock_, unsigned locktype)
{
	struct debug_lock *lock = lock_;
	EVUTIL_ASSERT(lock->count == 0);
	EVUTIL_ASSERT(locktype == lock->locktype);
	EVUTIL_ASSERT(DEBUG_LOCK_SIG == lock->signature);
	if (original_lock_fns_.free) {
		original_lock_fns_.free(lock->lock,
		    lock->locktype|EVTHREAD_LOCKTYPE_RECURSIVE);
	}
	lock->lock = NULL;
	lock->count = -100;
	lock->signature = 0x12300fda;
	mm_free(lock);
}